

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Branch * __thiscall
kj::ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch>::
add<kj::_::ArrayJoinPromiseNodeBase&,kj::Own<kj::_::PromiseNode>,kj::_::ExceptionOrValue&>
          (ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch> *this,
          ArrayJoinPromiseNodeBase *params,Own<kj::_::PromiseNode> *params_1,
          ExceptionOrValue *params_2)

{
  Branch *pBVar1;
  ArrayJoinPromiseNodeBase *params_00;
  Own<kj::_::PromiseNode> *params_1_00;
  ExceptionOrValue *params_2_00;
  ExceptionOrValue *params_local_2;
  Own<kj::_::PromiseNode> *params_local_1;
  ArrayJoinPromiseNodeBase *params_local;
  ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch> *this_local;
  
  if (this->pos < this->endPtr) {
    pBVar1 = this->pos;
    params_00 = fwd<kj::_::ArrayJoinPromiseNodeBase&>(params);
    params_1_00 = fwd<kj::Own<kj::_::PromiseNode>>(params_1);
    params_2_00 = fwd<kj::_::ExceptionOrValue&>(params_2);
    ctor<kj::_::ArrayJoinPromiseNodeBase::Branch,kj::_::ArrayJoinPromiseNodeBase&,kj::Own<kj::_::PromiseNode>,kj::_::ExceptionOrValue&>
              (pBVar1,params_00,params_1_00,params_2_00);
    pBVar1 = this->pos;
    this->pos = pBVar1 + 1;
    return pBVar1;
  }
  _::inlineRequireFailure
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array.h"
             ,399,"pos < endPtr","\"Added too many elements to ArrayBuilder.\"",
             "Added too many elements to ArrayBuilder.");
}

Assistant:

T& add(Params&&... params) {
    KJ_IREQUIRE(pos < endPtr, "Added too many elements to ArrayBuilder.");
    ctor(*pos, kj::fwd<Params>(params)...);
    return *pos++;
  }